

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

size_t draco::GetFileSize(string *file_name)

{
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  undefined4 extraout_var;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
  file_reader;
  nullptr_t in_stack_ffffffffffffffc8;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  string *in_stack_fffffffffffffff8;
  size_t sVar4;
  
  FileReaderFactory::OpenReader(in_stack_fffffffffffffff8);
  bVar1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    sVar4 = 0;
  }
  else {
    pFVar3 = std::
             unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
             ::operator->((unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
                           *)0x1164a9);
    iVar2 = (*pFVar3->_vptr_FileReaderInterface[4])();
    sVar4 = CONCAT44(extraout_var,iVar2);
  }
  std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>::
  ~unique_ptr((unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
               *)CONCAT44(1,in_stack_ffffffffffffffe0));
  return sVar4;
}

Assistant:

size_t GetFileSize(const std::string &file_name) {
  std::unique_ptr<FileReaderInterface> file_reader =
      FileReaderFactory::OpenReader(file_name);
  if (file_reader == nullptr) {
    return 0;
  }
  return file_reader->GetFileSize();
}